

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_timesamples_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,TimeSamples *v,uint32_t indent)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  uint32_t n;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  ulong uVar5;
  undefined1 in_R8B;
  long lVar6;
  stringstream ss;
  string local_1e8;
  TimeSamples *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined8 extraout_RDX;
  
  local_1c8 = v;
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{\n",2);
  n = (uint32_t)extraout_RDX;
  if (*(long *)(this + 8) != *(long *)this) {
    iVar2 = (int)local_1c8;
    lVar6 = 8;
    uVar5 = 0;
    uVar4 = extraout_RDX;
    do {
      pprint::Indent_abi_cxx11_(&local_1e8,(pprint *)(ulong)(iVar2 + 1),(uint32_t)uVar4);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (this[0x18] == (tinyusdz)0x1) {
        value::TimeSamples::update((TimeSamples *)this);
      }
      poVar3 = ::std::ostream::_M_insert<double>(*(double *)(*(long *)this + -8 + lVar6));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      if (this[0x18] == (tinyusdz)0x1) {
        value::TimeSamples::update((TimeSamples *)this);
      }
      value::pprint_value_abi_cxx11_
                (&local_1e8,(value *)(*(long *)this + lVar6),(Value *)0x0,1,(bool)in_R8B);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",\n",2);
      n = (uint32_t)extraout_RDX_00;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x28;
      uVar4 = extraout_RDX_00;
    } while (uVar5 < (ulong)((*(long *)(this + 8) - *(long *)this >> 3) * -0x3333333333333333));
  }
  pprint::Indent_abi_cxx11_(&local_1e8,(pprint *)local_1c8,n);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  psVar1 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string print_timesamples(const value::TimeSamples &v,
                              const uint32_t indent) {
  std::stringstream ss;

  ss << "{\n";

  for (size_t i = 0; i < v.size(); i++) {
    ss << pprint::Indent(indent + 1);
    ss << v.get_samples()[i].t << ": "
       << value::pprint_value(v.get_samples()[i].value);
    ss << ",\n";  // USDA allow ',' for the last item
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}